

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O1

bool __thiscall
despot::Adventurer::Step
          (Adventurer *this,State *s,double random_num,ACT_TYPE action,double *reward,OBS_TYPE *obs)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  double *pdVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  
  *reward = 0.0;
  iVar2 = *(int *)(s + 0xc);
  iVar3 = this->size_;
  iVar5 = iVar2 / iVar3;
  if ((action == 0) && (iVar2 % iVar3 == iVar3 + -1)) {
    *reward = (this->goal_reward_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar5];
  }
  else {
    lVar7 = *(long *)&(this->transition_probabilities_).
                      super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar2].
                      super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                      ._M_impl.super__Vector_impl_data;
    lVar4 = *(long *)(lVar7 + (long)action * 0x18);
    lVar7 = *(long *)(lVar7 + 8 + (long)action * 0x18) - lVar4;
    if (lVar7 == 0) {
      bVar8 = true;
    }
    else {
      lVar7 = lVar7 >> 5;
      lVar7 = lVar7 + -1 + (ulong)(lVar7 == 0);
      pdVar6 = (double *)(lVar4 + 0x18);
      bVar8 = true;
      dVar10 = 0.0;
      dVar11 = random_num;
      do {
        dVar1 = *pdVar6;
        dVar10 = dVar10 + dVar1;
        random_num = dVar11;
        if (dVar11 <= dVar10) {
          *(undefined4 *)(s + 0xc) = *(undefined4 *)((long)pdVar6 + -0xc);
          random_num = (dVar10 - dVar11) / dVar1;
          bVar8 = false;
        }
        bVar9 = lVar7 != 0;
        lVar7 = lVar7 + -1;
      } while ((dVar10 < dVar11) && (pdVar6 = pdVar6 + 4, dVar11 = random_num, bVar9));
    }
    if (!bVar8) {
      if (random_num < this->obs_noise_) {
        iVar5 = (iVar5 + (int)(random_num / (this->obs_noise_ / (double)(this->num_goals_ + -1))) +
                1) % this->num_goals_;
      }
      *obs = (long)iVar5;
      return false;
    }
    *reward = -10.0;
  }
  return true;
}

Assistant:

bool Adventurer::Step(State& s, double random_num, ACT_TYPE action, double& reward,
	OBS_TYPE& obs) const {
	AdventurerState& state = static_cast<AdventurerState&>(s);

	reward = 0.0;
	int position = state.state_id % size_;
	int goal_type = state.state_id / size_;

	if (position == size_ - 1 && action == A_STAY) {
		reward = goal_reward_[goal_type];
		return true;
	}

	bool terminal = true;
	const vector<State>& distribution =
		transition_probabilities_[state.state_id][action];
	double sum = 0;
	for (int i = 0; i < distribution.size(); i++) {
		const State& next = distribution[i];
		sum += next.weight;
		if (sum >= random_num) {
			terminal = false;
			state.state_id = next.state_id;

			random_num = (sum - random_num) / next.weight;
			break;
		}
	}

	if (terminal) {
		reward = -10;
		return true;
	}

	if (random_num >= obs_noise_) {
		obs = goal_type;
	} else {
		int index = int(random_num / (obs_noise_ / (num_goals_ - 1)));
		obs = (1 + index + goal_type) % num_goals_;
	}

	return false;
}